

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall IR::Instr::Copy(Instr *this,bool copyDst)

{
  undefined1 *puVar1;
  OpCode opcode;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  BailOutKind BVar6;
  uint32 uVar7;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *this_00;
  PragmaInstr *this_01;
  ProfiledInstr *this_02;
  JitProfilingInstr *this_03;
  Opnd *pOVar8;
  undefined4 *puVar9;
  
  if ((this->field_0x38 & 0x50) == 0) {
    switch(this->m_kind) {
    case InstrKindInstr:
      this_00 = (BailOutInstrTemplate<IR::Instr> *)New(this->m_opcode,this->m_func);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1ef,"((0))","Copy of other instr kinds NYI");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      this_00 = (BailOutInstrTemplate<IR::Instr> *)0x0;
      break;
    case InstrKindProfiled:
      this_02 = AsProfiledInstr(this);
      this_00 = (BailOutInstrTemplate<IR::Instr> *)ProfiledInstr::CopyProfiledInstr(this_02);
      break;
    case InstrKindPragma:
      this_01 = AsPragmaInstr(this);
      this_00 = (BailOutInstrTemplate<IR::Instr> *)PragmaInstr::CopyPragma(this_01);
      break;
    case InstrKindJitProfiling:
      this_03 = AsJitProfilingInstr(this);
      this_00 = (BailOutInstrTemplate<IR::Instr> *)JitProfilingInstr::CopyJitProfiling(this_03);
    }
  }
  else {
    opcode = this->m_opcode;
    BVar6 = GetBailOutKind(this);
    bailOutInfo = GetBailOutInfo(this);
    this_00 = BailOutInstrTemplate<IR::Instr>::New(opcode,BVar6,bailOutInfo,this->m_func);
    uVar7 = GetByteCodeOffset(this);
    SetByteCodeOffset(&this_00->super_Instr,uVar7);
    if ((this->field_0x38 & 0x40) != 0) {
      puVar1 = &(this_00->super_Instr).field_0x38;
      *puVar1 = *puVar1 | 0x40;
      BVar6 = GetAuxBailOutKind(this);
      SetAuxBailOutKind(&this_00->super_Instr,BVar6);
    }
  }
  if (copyDst && this->m_dst != (Opnd *)0x0) {
    pOVar8 = Opnd::Copy(this->m_dst,this->m_func);
    SetDst(&this_00->super_Instr,pOVar8);
  }
  if (this->m_src1 != (Opnd *)0x0) {
    pOVar8 = Opnd::Copy(this->m_src1,this->m_func);
    SetSrc1(&this_00->super_Instr,pOVar8);
    if (this->m_src2 != (Opnd *)0x0) {
      pOVar8 = Opnd::Copy(this->m_src2,this->m_func);
      SetSrc2(&this_00->super_Instr,pOVar8);
    }
  }
  uVar5 = *(ushort *)&(this_00->super_Instr).field_0x36 & 0xffdf |
          *(ushort *)&this->field_0x36 & 0x20;
  *(ushort *)&(this_00->super_Instr).field_0x36 = uVar5;
  pFVar2 = this->m_func->topFunc;
  if ((pFVar2->hasInstrNumber == false) && (pFVar2->maintainByteCodeOffset == true)) {
    uVar7 = GetByteCodeOffset(this);
    SetByteCodeOffset(&this_00->super_Instr,uVar7);
    uVar5 = *(ushort *)&(this_00->super_Instr).field_0x36;
  }
  *(ushort *)&(this_00->super_Instr).field_0x36 =
       uVar5 & 0xffef | *(ushort *)&this->field_0x36 & 0x10;
  return &this_00->super_Instr;
}

Assistant:

Instr *
Instr::Copy(bool copyDst)
{
    Instr * instrCopy;

    if (this->HasBailOutInfo() || this->HasAuxBailOut())
    {
        instrCopy = BailOutInstr::New(this->m_opcode, this->GetBailOutKind(), this->GetBailOutInfo(), this->m_func);
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
        if (this->HasAuxBailOut())
        {
            instrCopy->hasAuxBailOut = true;
            instrCopy->SetAuxBailOutKind(this->GetAuxBailOutKind());
        }
    }
    else
    {
        switch (this->GetKind())
        {
        case InstrKindInstr:
            instrCopy = Instr::New(this->m_opcode, this->m_func);
            break;

        case InstrKindProfiled:
            instrCopy = this->AsProfiledInstr()->CopyProfiledInstr();
            break;

        case InstrKindJitProfiling:
            instrCopy = this->AsJitProfilingInstr()->CopyJitProfiling();
            break;

        case InstrKindPragma:
            instrCopy = this->AsPragmaInstr()->CopyPragma();
            break;

        default:
            instrCopy = nullptr;
            AnalysisAssertMsg(UNREACHED, "Copy of other instr kinds NYI");
        }
    }

    Opnd * opnd = this->GetDst();
    if (copyDst && opnd)
    {
        instrCopy->SetDst(opnd->Copy(this->m_func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrCopy->SetSrc1(opnd->Copy(this->m_func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrCopy->SetSrc2(opnd->Copy(this->m_func));
        }
    }

    instrCopy->isInlineeEntryInstr = this->isInlineeEntryInstr;

    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrCopy->usesStackArgumentsObject = this->usesStackArgumentsObject;
    return instrCopy;
}